

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void write_io(Emulator *e,MaskedAddress addr,u8 value)

{
  EmulatorEvent *pEVar1;
  SGB *pSVar2;
  ushort uVar3;
  undefined2 uVar4;
  DmaState DVar5;
  PPUMode PVar6;
  SgbMask SVar7;
  TimaState TVar8;
  ulong uVar9;
  SGB *pSVar10;
  EmulatorState *pEVar11;
  byte pal;
  Address AVar12;
  RGBA RVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  RGBA *pRVar17;
  bool bVar18;
  byte bVar19;
  byte bVar20;
  SgbState SVar21;
  char *pcVar22;
  ulong uVar23;
  undefined8 uVar24;
  byte bVar25;
  int iVar26;
  undefined8 uVar27;
  size_t __n;
  ColorPalettes *pCVar28;
  JoypadSelect JVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  undefined6 in_register_00000032;
  char *func_name;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined8 uVar37;
  byte bVar38;
  uint uVar39;
  u8 *puVar40;
  RGBA *pRVar41;
  RGBA *pRVar42;
  byte bVar43;
  int x;
  Bool BVar44;
  ulong uVar45;
  long lVar46;
  short sVar47;
  PaletteType type;
  Bool BVar48;
  uint uVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  u8 *local_78;
  
  func_name = (char *)CONCAT62(in_register_00000032,addr);
  sVar47 = (short)((ulong)func_name & 0xffffffff);
  uVar45 = (ulong)addr;
  pcVar14 = "unknown";
  if ((uint)func_name < 0x100) {
    pcVar14 = *(char **)(get_io_reg_string_s_strings + uVar45 * 8);
  }
  pcVar15 = "unknown";
  if (pcVar14 != (char *)0x0) {
    pcVar15 = pcVar14;
  }
  pcVar14 = func_name;
  HOOK_write_io_asb(e,func_name,(ulong)func_name & 0xffffffff,pcVar15);
  uVar39 = (uint)addr;
  if (0x30 < uVar39 - 0x40) {
    switch(uVar45) {
    case 0:
      JVar29 = value >> 4 & JOYPAD_SELECT_NONE;
      (e->state).joyp.joypad_select = JVar29;
      if ((e->state).is_sgb == FALSE) goto switchD_0018c96e_caseD_8;
      switch((e->state).sgb.state) {
      case SGB_STATE_IDLE:
        if ((value >> 4 & 3) != 0) break;
        (e->state).sgb.bits_read = '\0';
        bVar43 = (e->state).sgb.current_packet + 1;
        (e->state).sgb.current_packet = bVar43;
        if ((e->state).sgb.packet_count <= bVar43) {
          (e->state).sgb.current_packet = '\0';
          (e->state).sgb.packet_count = '\0';
          (e->state).sgb.data[0] = '\0';
          (e->state).sgb.data[1] = '\0';
          (e->state).sgb.data[2] = '\0';
          (e->state).sgb.data[3] = '\0';
          (e->state).sgb.data[4] = '\0';
          (e->state).sgb.data[5] = '\0';
          (e->state).sgb.data[6] = '\0';
          (e->state).sgb.data[7] = '\0';
          (e->state).sgb.data[8] = '\0';
          (e->state).sgb.data[9] = '\0';
          (e->state).sgb.data[10] = '\0';
          (e->state).sgb.data[0xb] = '\0';
          (e->state).sgb.data[0xc] = '\0';
          (e->state).sgb.data[0xd] = '\0';
          (e->state).sgb.data[0xe] = '\0';
          (e->state).sgb.data[0xf] = '\0';
          pEVar11 = &e->state;
          (pEVar11->sgb).data[0x10] = '\0';
          (pEVar11->sgb).data[0x11] = '\0';
          (pEVar11->sgb).data[0x12] = '\0';
          (pEVar11->sgb).data[0x13] = '\0';
          (pEVar11->sgb).data[0x14] = '\0';
          (pEVar11->sgb).data[0x15] = '\0';
          (pEVar11->sgb).data[0x16] = '\0';
          (pEVar11->sgb).data[0x17] = '\0';
          (pEVar11->sgb).data[0x18] = '\0';
          (pEVar11->sgb).data[0x19] = '\0';
          (pEVar11->sgb).data[0x1a] = '\0';
          (pEVar11->sgb).data[0x1b] = '\0';
          (pEVar11->sgb).data[0x1c] = '\0';
          (pEVar11->sgb).data[0x1d] = '\0';
          (pEVar11->sgb).data[0x1e] = '\0';
          (pEVar11->sgb).data[0x1f] = '\0';
          pEVar11 = &e->state;
          (pEVar11->sgb).data[0x20] = '\0';
          (pEVar11->sgb).data[0x21] = '\0';
          (pEVar11->sgb).data[0x22] = '\0';
          (pEVar11->sgb).data[0x23] = '\0';
          (pEVar11->sgb).data[0x24] = '\0';
          (pEVar11->sgb).data[0x25] = '\0';
          (pEVar11->sgb).data[0x26] = '\0';
          (pEVar11->sgb).data[0x27] = '\0';
          (pEVar11->sgb).data[0x28] = '\0';
          (pEVar11->sgb).data[0x29] = '\0';
          (pEVar11->sgb).data[0x2a] = '\0';
          (pEVar11->sgb).data[0x2b] = '\0';
          (pEVar11->sgb).data[0x2c] = '\0';
          (pEVar11->sgb).data[0x2d] = '\0';
          (pEVar11->sgb).data[0x2e] = '\0';
          (pEVar11->sgb).data[0x2f] = '\0';
          pEVar11 = &e->state;
          (pEVar11->sgb).data[0x30] = '\0';
          (pEVar11->sgb).data[0x31] = '\0';
          (pEVar11->sgb).data[0x32] = '\0';
          (pEVar11->sgb).data[0x33] = '\0';
          (pEVar11->sgb).data[0x34] = '\0';
          (pEVar11->sgb).data[0x35] = '\0';
          (pEVar11->sgb).data[0x36] = '\0';
          (pEVar11->sgb).data[0x37] = '\0';
          (pEVar11->sgb).data[0x38] = '\0';
          (pEVar11->sgb).data[0x39] = '\0';
          (pEVar11->sgb).data[0x3a] = '\0';
          (pEVar11->sgb).data[0x3b] = '\0';
          (pEVar11->sgb).data[0x3c] = '\0';
          (pEVar11->sgb).data[0x3d] = '\0';
          (pEVar11->sgb).data[0x3e] = '\0';
          (pEVar11->sgb).data[0x3f] = '\0';
          pEVar11 = &e->state;
          (pEVar11->sgb).data[0x40] = '\0';
          (pEVar11->sgb).data[0x41] = '\0';
          (pEVar11->sgb).data[0x42] = '\0';
          (pEVar11->sgb).data[0x43] = '\0';
          (pEVar11->sgb).data[0x44] = '\0';
          (pEVar11->sgb).data[0x45] = '\0';
          (pEVar11->sgb).data[0x46] = '\0';
          (pEVar11->sgb).data[0x47] = '\0';
          (pEVar11->sgb).data[0x48] = '\0';
          (pEVar11->sgb).data[0x49] = '\0';
          (pEVar11->sgb).data[0x4a] = '\0';
          (pEVar11->sgb).data[0x4b] = '\0';
          (pEVar11->sgb).data[0x4c] = '\0';
          (pEVar11->sgb).data[0x4d] = '\0';
          (pEVar11->sgb).data[0x4e] = '\0';
          (pEVar11->sgb).data[0x4f] = '\0';
          pEVar11 = &e->state;
          (pEVar11->sgb).data[0x50] = '\0';
          (pEVar11->sgb).data[0x51] = '\0';
          (pEVar11->sgb).data[0x52] = '\0';
          (pEVar11->sgb).data[0x53] = '\0';
          (pEVar11->sgb).data[0x54] = '\0';
          (pEVar11->sgb).data[0x55] = '\0';
          (pEVar11->sgb).data[0x56] = '\0';
          (pEVar11->sgb).data[0x57] = '\0';
          (pEVar11->sgb).data[0x58] = '\0';
          (pEVar11->sgb).data[0x59] = '\0';
          (pEVar11->sgb).data[0x5a] = '\0';
          (pEVar11->sgb).data[0x5b] = '\0';
          (pEVar11->sgb).data[0x5c] = '\0';
          (pEVar11->sgb).data[0x5d] = '\0';
          (pEVar11->sgb).data[0x5e] = '\0';
          (pEVar11->sgb).data[0x5f] = '\0';
          pEVar11 = &e->state;
          (pEVar11->sgb).data[0x60] = '\0';
          (pEVar11->sgb).data[0x61] = '\0';
          (pEVar11->sgb).data[0x62] = '\0';
          (pEVar11->sgb).data[99] = '\0';
          (pEVar11->sgb).data[100] = '\0';
          (pEVar11->sgb).data[0x65] = '\0';
          (pEVar11->sgb).data[0x66] = '\0';
          (pEVar11->sgb).data[0x67] = '\0';
          (pEVar11->sgb).data[0x68] = '\0';
          (pEVar11->sgb).data[0x69] = '\0';
          (pEVar11->sgb).data[0x6a] = '\0';
          (pEVar11->sgb).data[0x6b] = '\0';
          (pEVar11->sgb).data[0x6c] = '\0';
          (pEVar11->sgb).data[0x6d] = '\0';
          (pEVar11->sgb).data[0x6e] = '\0';
          (pEVar11->sgb).data[0x6f] = '\0';
        }
LAB_0018c79d:
        (e->state).sgb.state = SGB_STATE_WAIT_BIT;
        goto LAB_0018c7ea;
      case SGB_STATE_WAIT_BIT:
        if (JVar29 != JOYPAD_SELECT_NONE) goto LAB_0018c7db;
        SVar21 = (e->state).sgb.bits_read >> 7 | SGB_STATE_READ_BIT;
        bVar52 = true;
LAB_0018c7d3:
        (e->state).sgb.state = SVar21;
        goto LAB_0018c811;
      case SGB_STATE_READ_BIT:
        if (JVar29 == JOYPAD_SELECT_DPAD) {
          puVar40 = &(e->state).sgb.bits_read;
          *puVar40 = *puVar40 + '\x01';
          (e->state).sgb.state = SGB_STATE_WAIT_BIT;
          goto switchD_0018c96e_caseD_8;
        }
        if (JVar29 == JOYPAD_SELECT_BUTTONS) {
          bVar43 = (e->state).sgb.bits_read;
          puVar40 = (e->state).sgb.data +
                    ((uint)(bVar43 >> 3) | (uint)(e->state).sgb.current_packet << 4);
          *puVar40 = *puVar40 | '\x01' << (bVar43 & 7);
          puVar40 = &(e->state).sgb.bits_read;
          *puVar40 = *puVar40 + '\x01';
          goto LAB_0018c79d;
        }
        break;
      case SGB_STATE_STOP_BIT:
        if (JVar29 == JOYPAD_SELECT_DPAD) {
          (e->state).sgb.state = SGB_STATE_STOP_WAIT;
          goto switchD_0018c96e_caseD_8;
        }
LAB_0018c7db:
        (e->state).sgb.state = SGB_STATE_IDLE;
        break;
      case SGB_STATE_STOP_WAIT:
        SVar21 = SGB_STATE_IDLE;
        bVar52 = false;
        if (JVar29 == JOYPAD_SELECT_NONE) goto LAB_0018c7d3;
      }
      if (JVar29 < JOYPAD_SELECT_DPAD) {
LAB_0018c7ea:
        if ((e->state).sgb.player_incremented == FALSE) {
          (e->state).sgb.player_incremented = TRUE;
        }
        goto switchD_0018c96e_caseD_8;
      }
      bVar52 = true;
      if (JVar29 != JOYPAD_SELECT_NONE) goto switchD_0018c96e_caseD_8;
LAB_0018c811:
      if ((e->state).sgb.player_incremented != FALSE) {
        (e->state).sgb.current_player =
             (e->state).sgb.current_player + 1 & (e->state).sgb.player_mask;
      }
      (e->state).sgb.player_incremented = FALSE;
      if (bVar52) goto switchD_0018c96e_caseD_8;
      bVar43 = (e->state).sgb.current_packet;
      if (bVar43 == 0) {
        bVar19 = (e->state).sgb.data[0] & 7;
        (e->state).sgb.packet_count = bVar19;
      }
      else {
        bVar19 = (e->state).sgb.packet_count;
      }
      if (bVar19 - 1 != (uint)bVar43) goto switchD_0018c96e_caseD_8;
      bVar43 = (e->state).sgb.data[0] >> 3;
      uVar45 = (ulong)(uint)bVar43;
      local_78 = (u8 *)0x0;
      if ((bVar43 < 0x16) && ((0x380800U >> (uint)bVar43 & 1) != 0)) {
        bVar19 = (e->state).vram.data
                 [(ulong)((e->state).ppu.lcdc.bg_tile_map_select != TILE_MAP_9800_9BFF) * 0x400 +
                  0x1800];
        if ((e->state).ppu.lcdc.bg_tile_data_select == TILE_DATA_8800_97FF) {
          uVar39 = (char)bVar19 * -0x10 + 0x800U & 0xffff;
          memcpy(do_sgb_s_temp_xfer_buffer,
                 (e->state).vram.data + ((char)bVar19 * 0x10 + 0x1000U & 0xffff),(ulong)uVar39);
          local_78 = do_sgb_s_temp_xfer_buffer;
          memcpy(do_sgb_s_temp_xfer_buffer + uVar39,(e->state).vram.data + 0x800,
                 (ulong)(0x1000 - uVar39));
        }
        else {
          local_78 = (e->state).vram.data + (ulong)bVar19 * 0x10;
        }
      }
      if (0x17 < bVar43) goto switchD_0018c96e_caseD_8;
      pSVar2 = &(e->state).sgb;
      switch(uVar45) {
      case 0:
      case 1:
      case 2:
      case 3:
        iVar32 = *(int *)(do_sgb_s_pals + uVar45 * 8 + 4);
        set_sgb_palette(e,*(int *)(do_sgb_s_pals + uVar45 * 8),(e->state).sgb.data[1],
                        (e->state).sgb.data[2],(e->state).sgb.data[3],(e->state).sgb.data[4],
                        (e->state).sgb.data[5],(e->state).sgb.data[6],(e->state).sgb.data[7],
                        (e->state).sgb.data[8]);
        set_sgb_palette(e,iVar32,(e->state).sgb.data[1],(e->state).sgb.data[2],
                        (e->state).sgb.data[9],(e->state).sgb.data[10],(e->state).sgb.data[0xb],
                        (e->state).sgb.data[0xc],(e->state).sgb.data[0xd],(e->state).sgb.data[0xe]);
        break;
      case 4:
        iVar32 = (int)(short)((ushort)(e->state).sgb.packet_count * 0x10 + -2);
        uVar36 = (iVar32 / 6 + (iVar32 >> 0x1f)) - (iVar32 * 0x2aab >> 0x1f) & 0xffff;
        uVar39 = (uint)(e->state).sgb.data[1];
        if (uVar36 < uVar39) {
          uVar39 = uVar36;
        }
        if (uVar39 != 0) {
          uVar45 = 0;
          do {
            bVar43 = (e->state).sgb.data[uVar45 * 6 + 2];
            bVar19 = (e->state).sgb.data[uVar45 * 6 + 3];
            bVar20 = (e->state).sgb.data[uVar45 * 6 + 4];
            bVar38 = (e->state).sgb.data[uVar45 * 6 + 5];
            uVar34 = (uint)(e->state).sgb.data[uVar45 * 6 + 6];
            bVar25 = (e->state).sgb.data[uVar45 * 6 + 7];
            uVar36 = (uint)bVar25;
            if ((bVar43 & 1) != 0) {
              set_sgb_attr_block(e,(uint)bVar20,(uint)bVar38,uVar34,(uint)bVar25,bVar19 & 3);
            }
            if ((bVar43 & 2) != 0) {
              pal = bVar19 >> 2 & 3;
              uVar49 = (uint)bVar38;
              set_sgb_attr_block(e,(uint)bVar20,uVar49,uVar34,uVar49,pal);
              uVar35 = (uint)bVar25;
              set_sgb_attr_block(e,(uint)bVar20,uVar49,(uint)bVar20,uVar35,pal);
              set_sgb_attr_block(e,(uint)bVar20,uVar35,uVar34,uVar35,pal);
              set_sgb_attr_block(e,uVar34,(uint)bVar38,uVar34,uVar35,pal);
            }
            if ((bVar43 & 4) != 0) {
              uVar49 = bVar19 >> 4 & 3;
              if (bVar38 != 0) {
                uVar35 = 0;
                iVar32 = 0;
                do {
                  iVar26 = 0;
                  uVar33 = uVar35;
                  do {
                    bVar43 = (byte)iVar26 & 6;
                    (e->state).sgb.attr_map[uVar33 >> 2] =
                         (byte)(uVar49 << (bVar43 ^ 6)) |
                         (e->state).sgb.attr_map[uVar33 >> 2] & (byte)(-0xc1 >> bVar43);
                    iVar26 = iVar26 + 2;
                    uVar33 = uVar33 + 1;
                  } while (iVar26 != 0x28);
                  uVar35 = uVar35 + 0x14;
                  bVar52 = iVar32 != bVar38 - 1;
                  iVar32 = iVar32 + 1;
                } while (bVar52);
              }
              set_sgb_attr_block(e,0,(uint)bVar38,bVar20 - 1,(uint)bVar25,(u8)uVar49);
              if (bVar25 < 0x11) {
                uVar35 = (uint)bVar25 * 0x14;
                do {
                  uVar35 = uVar35 + 0x14;
                  uVar36 = uVar36 + 1;
                  iVar32 = 0;
                  uVar33 = uVar35;
                  do {
                    bVar43 = (byte)iVar32 & 6;
                    (e->state).sgb.attr_map[uVar33 >> 2] =
                         (byte)(uVar49 << (bVar43 ^ 6)) |
                         (e->state).sgb.attr_map[uVar33 >> 2] & (byte)(-0xc1 >> bVar43);
                    iVar32 = iVar32 + 2;
                    uVar33 = uVar33 + 1;
                  } while (iVar32 != 0x28);
                } while (uVar36 != 0x11);
              }
              set_sgb_attr_block(e,uVar34 + 1,(uint)bVar38,0x13,(uint)bVar25,(u8)uVar49);
            }
            uVar45 = uVar45 + 1;
          } while (uVar45 != uVar39);
        }
        break;
      case 5:
        bVar43 = (e->state).sgb.data[1];
        uVar39 = (uint)(e->state).sgb.packet_count * 0x10 - 2;
        if ((int)(uint)bVar43 <= (int)uVar39) {
          uVar39 = (uint)bVar43;
        }
        if (0 < (int)uVar39) {
          uVar45 = 0;
          do {
            bVar43 = (e->state).sgb.data[uVar45 + 2];
            uVar36 = bVar43 & 0x1f;
            uVar34 = bVar43 >> 5 & 3;
            if ((char)bVar43 < '\0') {
              uVar36 = uVar36 * 0x14;
              iVar32 = 0;
              do {
                bVar43 = (byte)iVar32 & 6;
                (e->state).sgb.attr_map[uVar36 >> 2] =
                     (byte)(uVar34 << (bVar43 ^ 6)) |
                     (e->state).sgb.attr_map[uVar36 >> 2] & (byte)(-0xc1 >> bVar43);
                iVar32 = iVar32 + 2;
                uVar36 = uVar36 + 1;
              } while (iVar32 != 0x28);
            }
            else {
              bVar43 = (char)uVar36 * '\x02' & 6;
              lVar16 = (ulong)(uVar36 >> 2) + 0x3340a;
              lVar30 = 0;
              do {
                (e->state).sgb.attr_map[lVar30 + lVar16 + -0x3340a] =
                     (e->state).sgb.attr_map[lVar30 + lVar16 + -0x3340a] & (byte)(-0xc1 >> bVar43) |
                     (byte)(uVar34 << (bVar43 ^ 6));
                lVar30 = lVar30 + 5;
              } while (lVar30 != 0x5a);
            }
            uVar45 = uVar45 + 1;
          } while (uVar45 != uVar39);
        }
        break;
      case 6:
        bVar43 = (e->state).sgb.data[1];
        bVar38 = bVar43 >> 2 & 3;
        bVar20 = bVar43 >> 4 & 3;
        bVar19 = (e->state).sgb.data[2];
        uVar39 = (uint)bVar19;
        iVar32 = bVar19 + 1;
        if ((bVar43 & 0x40) == 0) {
          set_sgb_attr_block(e,0,0,bVar19 - 1,0x11,bVar20);
          set_sgb_attr_block(e,uVar39,0,(uint)bVar19,0x11,bVar38);
          iVar26 = iVar32;
          iVar32 = 0;
        }
        else {
          set_sgb_attr_block(e,0,0,0x13,bVar19 - 1,bVar20);
          set_sgb_attr_block(e,0,uVar39,0x13,uVar39,bVar38);
          iVar26 = 0;
        }
        set_sgb_attr_block(e,iVar26,iVar32,0x13,0x11,bVar43 & 3);
        break;
      case 7:
        bVar52 = (e->state).sgb.data[5] == '\0';
        uVar39 = (uint)(e->state).sgb.packet_count * 0x40 - 0x18;
        uVar36 = (uint)*(ushort *)((e->state).sgb.data + 3);
        if ((int)uVar36 < (int)uVar39) {
          uVar39 = uVar36;
        }
        if (0 < (int)uVar39) {
          uVar36 = 0x168;
          if (uVar39 < 0x168) {
            uVar36 = uVar39;
          }
          uVar49 = (uint)(e->state).sgb.data[1];
          uVar34 = 4;
          if (uVar39 < 4) {
            uVar34 = uVar39;
          }
          uVar39 = (uint)(e->state).sgb.data[2];
          uVar45 = 0;
          do {
            bVar43 = (e->state).sgb.data[(uVar45 >> 2) + 6];
            iVar32 = 6;
            do {
              uVar35 = uVar49 + bVar52;
              bVar19 = (byte)uVar35;
              bVar20 = ((char)uVar39 + !bVar52 + '\x01') - (bVar19 < 0x14);
              uVar35 = uVar35 & 0xff;
              if (0x13 < bVar19) {
                uVar35 = 0;
              }
              set_sgb_attr_block(e,uVar49,uVar39,uVar49,uVar39,bVar43 >> ((byte)iVar32 & 0x1f));
              uVar49 = uVar35 + 1 & 0xff;
              if (0x12 < (byte)uVar35) {
                uVar49 = 0;
              }
              uVar39 = 0;
              if (bVar20 < 0x12) {
                uVar49 = uVar35;
                uVar39 = (uint)bVar20;
              }
              iVar26 = uVar34 * 2 + iVar32;
              iVar32 = iVar32 + -2;
            } while (iVar26 != 8);
            uVar45 = uVar45 + 4;
          } while (uVar45 < uVar36);
        }
        break;
      case 10:
        unpack_sgb_palette_ram(e,3,(e->state).sgb.data[7],(e->state).sgb.data[8]);
        unpack_sgb_palette_ram(e,2,(e->state).sgb.data[5],(e->state).sgb.data[6]);
        unpack_sgb_palette_ram(e,1,(e->state).sgb.data[3],(e->state).sgb.data[4]);
        unpack_sgb_palette_ram(e,0,(e->state).sgb.data[1],(e->state).sgb.data[2]);
        bVar43 = (e->state).sgb.data[9];
        if (-1 < (char)bVar43) break;
        goto LAB_0018d2ec;
      case 0xb:
        puVar40 = (e->state).sgb.pal_ram;
        goto LAB_0018d263;
      case 0x11:
        (e->state).sgb.player_mask = (e->state).sgb.data[1] & 3;
        break;
      case 0x13:
        puVar40 = pSVar2->chr_ram + (((e->state).sgb.data[1] & 1) << 0xc);
LAB_0018d263:
        __n = 0x1000;
LAB_0018d268:
        memcpy(puVar40,local_78,__n);
        break;
      case 0x14:
        pRVar17 = (e->state).sgb.border_pal[0] + 1;
        puVar40 = local_78 + 0x803;
        lVar16 = 0;
        do {
          (e->state).sgb.border_pal[lVar16][0] = 0;
          lVar30 = 0;
          do {
            RVar13 = unpack_cgb_color((Emulator *)(ulong)e->cgb_color_curve,
                                      *(u16 *)(puVar40 + lVar30 * 2 + -1));
            pRVar17[lVar30] = RVar13;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 0xf);
          lVar16 = lVar16 + 1;
          pRVar17 = pRVar17 + 0x10;
          puVar40 = puVar40 + 0x20;
        } while (lVar16 != 4);
        pRVar17 = e->sgb_frame_buffer;
        lVar16 = 0;
        do {
          lVar30 = 0;
          pRVar41 = pRVar17;
          do {
            lVar31 = lVar16 * 0x40 + lVar30 * 2;
            bVar43 = local_78[lVar31 + 1];
            pSVar10 = (SGB *)((e->state).sgb.chr_ram + 0xe);
            if (-1 < (char)bVar43) {
              pSVar10 = pSVar2;
            }
            puVar40 = pSVar10->chr_ram + (ulong)local_78[lVar31] * 0x20;
            lVar31 = 0;
            pRVar42 = pRVar41;
            do {
              bVar19 = *puVar40;
              bVar20 = puVar40[1];
              bVar38 = puVar40[0x10];
              bVar25 = puVar40[0x11];
              if ((bVar43 & 0x40) == 0) {
                bVar19 = bVar19 << 4 | bVar19 >> 4;
                bVar19 = bVar19 >> 2 & 0x33 | (bVar19 & 0x33) << 2;
                bVar19 = bVar19 >> 1 & 0x55 | (bVar19 & 0x55) * '\x02';
                bVar20 = bVar20 << 4 | bVar20 >> 4;
                bVar20 = bVar20 >> 2 & 0x33 | (bVar20 & 0x33) << 2;
                bVar20 = bVar20 >> 1 & 0x55 | (bVar20 & 0x55) * '\x02';
                bVar38 = bVar38 << 4 | bVar38 >> 4;
                bVar38 = bVar38 >> 2 & 0x33 | (bVar38 & 0x33) << 2;
                bVar38 = bVar38 >> 1 & 0x55 | (bVar38 & 0x55) * '\x02';
                bVar25 = bVar25 << 4 | bVar25 >> 4;
                bVar25 = bVar25 >> 2 & 0x33 | (bVar25 & 0x33) << 2;
                bVar25 = bVar25 >> 1 & 0x55 | (bVar25 & 0x55) * '\x02';
              }
              uVar45 = (ulong)bVar25;
              lVar46 = 0;
              do {
                pRVar42[lVar46] =
                     *(RGBA *)((long)(e->state).sgb.border_pal[0] +
                              (ulong)(((uint)(bVar19 & 1) |
                                      ((uint)uVar45 & 1) * 8 + (bVar38 & 1) * 4) + (bVar20 & 1) * 2)
                              * 4 + (ulong)((bVar43 >> 2 & 3) << 6));
                bVar19 = bVar19 >> 1;
                bVar20 = bVar20 >> 1;
                bVar38 = bVar38 >> 1;
                uVar45 = uVar45 >> 1;
                lVar46 = lVar46 + 1;
              } while (lVar46 != 8);
              lVar31 = lVar31 + 1;
              puVar40 = puVar40 + (ulong)(-1 < (char)bVar43) * 4 + -2;
              pRVar42 = pRVar42 + 0x100;
            } while (lVar31 != 8);
            lVar30 = lVar30 + 1;
            pRVar41 = pRVar41 + 8;
          } while (lVar30 != 0x20);
          lVar16 = lVar16 + 1;
          pRVar17 = pRVar17 + 0x800;
        } while (lVar16 != 0x1c);
        SVar7 = (e->state).sgb.mask;
        if (SGB_MASK_FREEZE < SVar7) {
          RVar13 = 0xff000000;
          if (SVar7 == SGB_MASK_COLOR0) {
            RVar13 = (e->state).sgb.screen_pal[0].color[0];
          }
          lVar16 = 0;
          do {
            pRVar17 = e->frame_buffer + lVar16;
            *pRVar17 = RVar13;
            pRVar17[1] = RVar13;
            pRVar17[2] = RVar13;
            pRVar17[3] = RVar13;
            lVar16 = lVar16 + 4;
          } while (lVar16 != 0x5a00);
        }
        break;
      case 0x15:
        puVar40 = (e->state).sgb.attr_ram;
        __n = 0xfd2;
        goto LAB_0018d268;
      case 0x16:
        bVar43 = (e->state).sgb.data[1];
LAB_0018d2ec:
        if ((byte)(bVar43 & 0x3f) < 0x2d) {
          memcpy((e->state).sgb.attr_map,(e->state).sgb.attr_ram + (ulong)(bVar43 & 0x3f) * 0x5a,
                 0x5a);
        }
        if ((bVar43 & 0x40) != 0) {
          (e->state).sgb.mask = SGB_MASK_CANCEL;
        }
        break;
      case 0x17:
        bVar43 = (e->state).sgb.data[1];
        if ((bVar43 < 4) && ((e->state).sgb.mask = (uint)bVar43, 1 < bVar43)) {
          RVar13 = 0xff000000;
          if (bVar43 == 3) {
            RVar13 = (e->state).sgb.screen_pal[0].color[0];
          }
          lVar16 = 0;
          do {
            pRVar17 = e->frame_buffer + lVar16;
            *pRVar17 = RVar13;
            pRVar17[1] = RVar13;
            pRVar17[2] = RVar13;
            pRVar17[3] = RVar13;
            lVar16 = lVar16 + 4;
          } while (lVar16 != 0x5a00);
        }
      }
switchD_0018c96e_caseD_8:
      check_joyp_intr(e);
      return;
    case 1:
      serial_synchronize(e);
      (e->state).serial.sb = value;
      return;
    case 2:
      serial_synchronize(e);
      (e->state).serial.transferring = (uint)(value >> 7);
      (e->state).serial.clock = value & TRUE;
      if ((char)value < '\0') {
        (e->state).serial.tick_count = 0;
        (e->state).serial.transferred_bits = '\0';
      }
      calculate_next_serial_intr(e);
      return;
    case 3:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      goto switchD_0018bd65_caseD_4c;
    case 4:
      timer_synchronize(e);
      if (((e->state).timer.on != FALSE) &&
         (((e->state).timer.div_counter & s_tima_mask[(e->state).timer.clock_select]) != 0)) {
        increment_tima(e);
      }
      (e->state).timer.div_counter = 0;
      goto LAB_0018c6c4;
    case 5:
      timer_synchronize(e);
      if ((e->state).timer.on == FALSE) {
        (e->state).timer.tima = value;
        return;
      }
      TVar8 = (e->state).timer.tima_state;
      if (TVar8 == TIMA_STATE_RESET) goto LAB_0018c6c4;
      if (TVar8 == TIMA_STATE_OVERFLOW) {
        (e->state).timer.tima_state = TIMA_STATE_NORMAL;
        puVar40 = &(e->state).interrupt.new_if;
        *puVar40 = *puVar40 & 0xfb;
      }
      break;
    case 6:
      timer_synchronize(e);
      (e->state).timer.tma = value;
      if (((e->state).timer.on == FALSE) || ((e->state).timer.tima_state != TIMA_STATE_RESET))
      goto LAB_0018c6c4;
      break;
    case 7:
      timer_synchronize(e);
      uVar3 = s_tima_mask[(e->state).timer.clock_select];
      (e->state).timer.clock_select = value & TIMER_CLOCK_16384_HZ;
      BVar44 = (e->state).timer.on;
      (e->state).timer.on = value >> 2 & TRUE;
      if (BVar44 == FALSE) {
        if ((value >> 2 & 1) == 0) {
          uVar4 = (e->state).timer.div_counter;
          if (((uVar4 & uVar3) == 0) || ((uVar4 & s_tima_mask[value & TIMER_CLOCK_16384_HZ]) != 0))
          goto LAB_0018c6c4;
        }
        else if (((e->state).timer.div_counter & uVar3) == 0) goto LAB_0018c6c4;
        increment_tima(e);
      }
      goto LAB_0018c6c4;
    case 0xf:
      intr_synchronize(e);
      (e->state).interrupt.if_ = value & 0x1f;
      (e->state).interrupt.new_if = value & 0x1f;
      return;
    default:
      if (uVar39 == 0xff) {
        (e->state).interrupt.ie = value;
        return;
      }
      goto switchD_0018bd65_caseD_4c;
    }
    (e->state).timer.tima = value;
LAB_0018c6c4:
    calculate_next_timer_intr(e);
    return;
  }
  switch(uVar39) {
  case 0x40:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    BVar44 = (e->state).ppu.lcdc.display;
    (e->state).ppu.lcdc.display = (uint)(value >> 7);
    (e->state).ppu.lcdc.window_tile_map_select = value >> 6 & TILE_MAP_9C00_9FFF;
    (e->state).ppu.lcdc.window_display = value >> 5 & TRUE;
    (e->state).ppu.lcdc.bg_tile_data_select = value >> 4 & TILE_DATA_8000_8FFF;
    (e->state).ppu.lcdc.bg_tile_map_select = value >> 3 & TILE_MAP_9C00_9FFF;
    (e->state).ppu.lcdc.obj_size = value >> 2 & OBJ_SIZE_8X16;
    (e->state).ppu.lcdc.obj_display = value >> 1 & TRUE;
    (e->state).ppu.lcdc.bg_display = value & TRUE;
    if (BVar44 == value >> 7) {
      return;
    }
    (e->state).ppu.stat.mode = PPU_MODE_HBLANK;
    (e->state).ppu.line_y = '\0';
    (e->state).ppu.ly = '\0';
    if ((char)value < '\0') {
      pcVar14 = (char *)0x0;
      check_ly_eq_lyc(e,FALSE);
      HOOK_enable_display_v(e,pcVar14);
      (e->state).ppu.state = PPU_STATE_LCD_ON_MODE2;
      (e->state).ppu.state_ticks = 0x50;
      (e->state).ppu.line_start_ticks = (e->state).ticks - 5 & 0xfffffffffffffffc;
      (e->state).ppu.display_delay_frames = '\x04';
      (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE2;
    }
    else {
      HOOK_disable_display_v(e,pcVar14);
      if ((e->state).is_sgb == FALSE) {
        memset(e->frame_buffer,0xff,0x16800);
      }
      else {
        SVar7 = (e->state).sgb.mask;
        if (SGB_MASK_FREEZE < SVar7) {
          RVar13 = 0xff000000;
          if (SVar7 == SGB_MASK_COLOR0) {
            RVar13 = (e->state).sgb.screen_pal[0].color[0];
          }
          lVar16 = 0;
          do {
            pRVar17 = e->frame_buffer + lVar16;
            *pRVar17 = RVar13;
            pRVar17[1] = RVar13;
            pRVar17[2] = RVar13;
            pRVar17[3] = RVar13;
            lVar16 = lVar16 + 4;
          } while (lVar16 != 0x5a00);
        }
      }
      pEVar1 = &(e->state).event;
      *(byte *)pEVar1 = (byte)*pEVar1 | 1;
    }
    if ((e->state).ppu.lcdc.display == FALSE) {
      uVar45 = 0xffffffffffffffff;
    }
    else {
LAB_0018c700:
      uVar45 = (ulong)(e->state).ppu.state_ticks + (e->state).ppu.sync_ticks;
    }
    goto LAB_0018c70d;
  case 0x41:
    ppu_synchronize(e);
    BVar44 = value >> 4 & TRUE;
    BVar48 = value >> 3 & TRUE;
    if ((e->state).ppu.lcdc.display == FALSE) {
      bVar52 = true;
    }
    else {
      PVar6 = (e->state).ppu.stat.trigger_mode;
      if (PVar6 == PPU_MODE_VBLANK) {
        bVar18 = (e->state).ppu.stat.vblank.irq == FALSE;
        bVar50 = false;
      }
      else {
        if (PVar6 == PPU_MODE_HBLANK) {
          bVar50 = (e->state).ppu.stat.hblank.irq == FALSE;
        }
        else {
          bVar50 = false;
        }
        bVar18 = false;
      }
      if ((e->state).ppu.stat.new_ly_eq_lyc == FALSE) {
        bVar51 = false;
      }
      else {
        bVar51 = (e->state).ppu.stat.y_compare.irq == FALSE;
      }
      if ((e->state).is_cgb != FALSE) {
        bVar50 = (bool)(bVar50 & (byte)BVar48);
        bVar18 = (bool)(bVar18 & (byte)BVar44);
      }
      bVar52 = false;
      if (((e->state).ppu.stat.if_ == FALSE) &&
         (bVar52 = false, (bVar50 != false || bVar18 != false) || bVar51)) {
        uVar27 = 0x59;
        if (!bVar51) {
          uVar27 = 0x2e;
        }
        uVar24 = 0x56;
        if (bVar18 == false) {
          uVar24 = 0x2e;
        }
        uVar37 = 0x48;
        if (bVar50 == false) {
          uVar37 = 0x2e;
        }
        pcVar14 = (char *)((e->state).ticks + 4);
        HOOK_trigger_stat_from_write_cccii
                  (e,pcVar14,uVar27,uVar24,uVar37,(ulong)(e->state).ppu.ly,pcVar14);
        puVar40 = &(e->state).interrupt.new_if;
        *puVar40 = *puVar40 | 2;
        puVar40 = &(e->state).interrupt.if_;
        *puVar40 = *puVar40 | 2;
        (e->state).ppu.stat.if_ = TRUE;
        bVar52 = (e->state).ppu.lcdc.display == FALSE;
      }
    }
    (e->state).ppu.stat.y_compare.irq = value >> 6 & TRUE;
    (e->state).ppu.stat.mode2.irq = value >> 5 & TRUE;
    (e->state).ppu.stat.vblank.irq = BVar44;
    (e->state).ppu.stat.hblank.irq = BVar48;
    uVar45 = 0xffffffffffffffff;
    if (!bVar52) goto LAB_0018c700;
LAB_0018c70d:
    (e->state).ppu.next_intr_ticks = uVar45;
    uVar9 = (e->state).serial.next_intr_ticks;
    uVar23 = (e->state).timer.next_intr_ticks;
    if (uVar9 < uVar23) {
      uVar23 = uVar9;
    }
    if (uVar45 <= uVar23) {
      uVar23 = uVar45;
    }
    (e->state).next_intr_ticks = uVar23;
    break;
  case 0x42:
    ppu_mode3_synchronize(e);
    (e->state).ppu.scy = value;
    break;
  case 0x43:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    (e->state).ppu.scx = value;
    break;
  case 0x44:
    break;
  case 0x45:
    ppu_synchronize(e);
    (e->state).ppu.lyc = value;
    uVar45 = 0xffffffffffffffff;
    if ((e->state).ppu.lcdc.display != FALSE) {
      check_ly_eq_lyc(e,TRUE);
      check_stat(e);
      if ((e->state).ppu.lcdc.display != FALSE) {
        uVar45 = (ulong)(e->state).ppu.state_ticks + (e->state).ppu.sync_ticks;
      }
    }
    (e->state).ppu.next_intr_ticks = uVar45;
    uVar9 = (e->state).serial.next_intr_ticks;
    uVar23 = (e->state).timer.next_intr_ticks;
    if (uVar9 < uVar23) {
      uVar23 = uVar9;
    }
    if (uVar45 <= uVar23) {
      uVar23 = uVar45;
    }
    (e->state).next_intr_ticks = uVar23;
    break;
  case 0x46:
    dma_synchronize(e);
    (e->state).dma.sync_ticks = (e->state).ticks;
    (e->state).dma.tick_count = 0;
    DVar5 = (e->state).dma.state;
    (e->state).dma.state = DVar5 + (DVar5 == DMA_INACTIVE);
    (e->state).dma.source = (ushort)value << 8;
    break;
  case 0x47:
  case 0x48:
  case 0x49:
    type = (uint)func_name - 0x47;
    ppu_mode3_synchronize(e);
    (e->state).ppu.pal[type].color[3] = (uint)(value >> 6);
    (e->state).ppu.pal[type].color[2] = value >> 4 & COLOR_BLACK;
    (e->state).ppu.pal[type].color[1] = value >> 2 & COLOR_BLACK;
    (e->state).ppu.pal[type].color[0] = value & 3;
    update_bw_palette_rgba(e,type);
    return;
  case 0x4a:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    (e->state).ppu.wy = value;
    break;
  case 0x4b:
    ppu_mode3_synchronize(e);
    (e->state).ppu.wx = value;
    break;
  default:
    goto switchD_0018bd65_caseD_4c;
  case 0x4d:
    if ((e->state).is_cgb != FALSE) {
      (e->state).cpu_speed.switching = value & TRUE;
    }
    break;
  case 0x4f:
    if ((e->state).is_cgb != FALSE) {
      (e->state).vram.bank = value & 1;
      (e->state).vram.offset = (ushort)(value & 1) << 0xd;
    }
    break;
  case 0x51:
    if ((e->state).is_cgb != FALSE) {
      *(u8 *)((long)&(e->state).hdma.source + 1) = value;
    }
    break;
  case 0x52:
    if ((e->state).is_cgb != FALSE) {
      *(byte *)&(e->state).hdma.source = value & 0xf0;
    }
    break;
  case 0x53:
    if ((e->state).is_cgb != FALSE) {
      *(u8 *)((long)&(e->state).hdma.dest + 1) = value;
    }
    break;
  case 0x54:
    if ((e->state).is_cgb != FALSE) {
      *(byte *)&(e->state).hdma.dest = value & 0xf0;
    }
    break;
  case 0x55:
    if ((e->state).is_cgb != FALSE) {
      if (((e->state).hdma.mode == HDMA_TRANSFER_MODE_HDMA) &&
         (bVar43 = (e->state).hdma.blocks, -1 < (char)bVar43)) {
        if ((char)value < '\0') {
          (e->state).hdma.blocks = value & 0x7f;
          (e->state).hdma.mode = HDMA_TRANSFER_MODE_HDMA;
        }
        else {
          (e->state).hdma.blocks = bVar43 | value | 0x80;
        }
      }
      else {
        (e->state).hdma.mode = (uint)(value >> 7);
        (e->state).hdma.blocks = value & 0x7f;
        if (-1 < (char)value) {
          (e->state).hdma.state = DMA_ACTIVE;
        }
      }
    }
    break;
  case 0x56:
    if ((e->state).is_cgb != FALSE) {
      (e->state).infrared.write = value & TRUE;
      (e->state).infrared.enabled = (uint)(value >> 6);
    }
    break;
  case 0x68:
  case 0x6a:
    if ((e->state).is_cgb != FALSE) {
      ppu_mode3_synchronize(e);
      pCVar28 = &(e->state).ppu.bgcp;
      if (sVar47 != 0x68) {
        pCVar28 = &(e->state).ppu.obcp;
      }
      pCVar28->index = value & 0x3f;
      pCVar28->auto_increment = (uint)(value >> 7);
    }
    break;
  case 0x69:
  case 0x6b:
    if ((e->state).is_cgb != FALSE) {
      ppu_mode3_synchronize(e);
      pCVar28 = &(e->state).ppu.obcp;
      if (sVar47 == 0x69) {
        pCVar28 = &(e->state).ppu.bgcp;
      }
      pCVar28->data[pCVar28->index] = value;
      bVar43 = pCVar28->index;
      RVar13 = unpack_cgb_color((Emulator *)(ulong)e->cgb_color_curve,
                                CONCAT11(pCVar28->data[(ulong)bVar43 | 1],
                                         pCVar28->data[bVar43 & 0xfffffffe]));
      *(RGBA *)((long)pCVar28->palettes[0].color +
               (ulong)((uint)bVar43 + (uint)bVar43 & 0xc) +
               (ulong)((uint)bVar43 + (uint)bVar43 & 0x70)) = RVar13;
      if (pCVar28->auto_increment != FALSE) {
        pCVar28->index = bVar43 + 1 & 0x3f;
      }
    }
    break;
  case 0x70:
    if ((e->state).is_cgb != FALSE) {
      bVar43 = value & 7;
      (e->state).wram.bank = bVar43;
      AVar12 = 0x1000;
      if (bVar43 != 0) {
        AVar12 = (ushort)bVar43 << 0xc;
      }
      (e->state).wram.offset = AVar12;
    }
  }
  return;
switchD_0018bd65_caseD_4c:
  pcVar15 = "unknown";
  if (uVar39 < 0x100) {
    pcVar15 = *(char **)(get_io_reg_string_s_strings + uVar45 * 8);
  }
  pcVar22 = "unknown";
  if (pcVar15 != (char *)0x0) {
    pcVar22 = pcVar15;
  }
  HOOK_write_io_ignored_as(e,pcVar14,(ulong)func_name & 0xffffffff,pcVar22,(ulong)value);
  return;
}

Assistant:

static void write_io(Emulator* e, MaskedAddress addr, u8 value) {
  HOOK(write_io_asb, addr, get_io_reg_string(addr), value);
  switch (addr) {
    case IO_JOYP_ADDR:
      JOYP.joypad_select = UNPACK(value, JOYP_JOYPAD_SELECT);
      do_sgb(e);
      check_joyp_intr(e);
      break;
    case IO_SB_ADDR:
      serial_synchronize(e);
      SERIAL.sb = value;
#if RGBDS_LIVE
      EM_ASM({emulator.serialCallback($0);}, value);
#endif
      break;
    case IO_SC_ADDR:
      serial_synchronize(e);
      SERIAL.transferring = UNPACK(value, SC_TRANSFER_START);
      SERIAL.clock = UNPACK(value, SC_SHIFT_CLOCK);
      if (SERIAL.transferring) {
        SERIAL.tick_count = 0;
        SERIAL.transferred_bits = 0;
      }
      calculate_next_serial_intr(e);
      break;
    case IO_DIV_ADDR:
      timer_synchronize(e);
      clear_div(e);
      calculate_next_timer_intr(e);
      break;
    case IO_TIMA_ADDR:
      timer_synchronize(e);
      if (TIMER.on) {
        if (UNLIKELY(TIMER.tima_state == TIMA_STATE_OVERFLOW)) {
          /* Cancel the overflow and interrupt if written on the same tick. */
          TIMER.tima_state = TIMA_STATE_NORMAL;
          INTR.new_if &= ~IF_TIMER;
          TIMER.tima = value;
        } else if (TIMER.tima_state != TIMA_STATE_RESET) {
          /* Only update tima if it wasn't reset this tick. */
          TIMER.tima = value;
        }
        calculate_next_timer_intr(e);
      } else {
        TIMER.tima = value;
      }
      break;
    case IO_TMA_ADDR:
      timer_synchronize(e);
      TIMER.tma = value;
      if (UNLIKELY(TIMER.on && TIMER.tima_state == TIMA_STATE_RESET)) {
        TIMER.tima = value;
      }
      calculate_next_timer_intr(e);
      break;
    case IO_TAC_ADDR: {
      timer_synchronize(e);
      Bool old_timer_on = TIMER.on;
      u16 old_tima_mask = s_tima_mask[TIMER.clock_select];
      TIMER.clock_select = UNPACK(value, TAC_CLOCK_SELECT);
      TIMER.on = UNPACK(value, TAC_TIMER_ON);
      /* tima is incremented when a specific bit of div_counter transitions
       * from 1 to 0. This can happen as a result of writing to DIV, or in this
       * case modifying which bit we're looking at. */
      Bool tima_tick = FALSE;
      if (!old_timer_on) {
        u16 tima_mask = s_tima_mask[TIMER.clock_select];
        if (TIMER.on) {
          tima_tick = (TIMER.div_counter & old_tima_mask) != 0;
        } else {
          tima_tick = (TIMER.div_counter & old_tima_mask) != 0 &&
                      (TIMER.div_counter & tima_mask) == 0;
        }
        if (tima_tick) {
          increment_tima(e);
        }
      }
      calculate_next_timer_intr(e);
      break;
    }
    case IO_IF_ADDR:
      intr_synchronize(e);
      INTR.new_if = INTR.if_ = value & IF_ALL;
      break;
    case IO_LCDC_ADDR: {
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      Bool was_enabled = LCDC.display;
      LCDC.display = UNPACK(value, LCDC_DISPLAY);
      LCDC.window_tile_map_select = UNPACK(value, LCDC_WINDOW_TILE_MAP_SELECT);
      LCDC.window_display = UNPACK(value, LCDC_WINDOW_DISPLAY);
      LCDC.bg_tile_data_select = UNPACK(value, LCDC_BG_TILE_DATA_SELECT);
      LCDC.bg_tile_map_select = UNPACK(value, LCDC_BG_TILE_MAP_SELECT);
      LCDC.obj_size = UNPACK(value, LCDC_OBJ_SIZE);
      LCDC.obj_display = UNPACK(value, LCDC_OBJ_DISPLAY);
      LCDC.bg_display = UNPACK(value, LCDC_BG_DISPLAY);
      if (was_enabled ^ LCDC.display) {
        STAT.mode = PPU_MODE_HBLANK;
        PPU.ly = PPU.line_y = 0;
        if (LCDC.display) {
          check_ly_eq_lyc(e, FALSE);
          HOOK0(enable_display_v);
          PPU.state = PPU_STATE_LCD_ON_MODE2;
          PPU.state_ticks = PPU_MODE2_TICKS;
          PPU.line_start_ticks =
              ALIGN_UP(TICKS - CPU_TICK - CPU_TICK, CPU_TICK);
          PPU.display_delay_frames = PPU_ENABLE_DISPLAY_DELAY_FRAMES;
          STAT.trigger_mode = PPU_MODE_MODE2;
        } else {
          HOOK0(disable_display_v);
          /* Clear the framebuffer. */
          if (IS_SGB) {
            update_sgb_mask(e);
          } else {
            clear_frame_buffer(e, RGBA_WHITE);
          }
          e->state.event |= EMULATOR_EVENT_NEW_FRAME;
        }
        calculate_next_ppu_intr(e);
      }
      break;
    }
    case IO_STAT_ADDR: {
      ppu_synchronize(e);
      Bool new_vblank_irq = UNPACK(value, STAT_VBLANK_INTR);
      Bool new_hblank_irq = UNPACK(value, STAT_HBLANK_INTR);
      if (LCDC.display) {
        Bool hblank = TRIGGER_MODE_IS(HBLANK) && !STAT.hblank.irq;
        Bool vblank = TRIGGER_MODE_IS(VBLANK) && !STAT.vblank.irq;
        Bool y_compare = STAT.new_ly_eq_lyc && !STAT.y_compare.irq;
        if (IS_CGB) {
          /* CGB only triggers on STAT write if the value being written
           * actually sets that IRQ */
          hblank = hblank && new_hblank_irq;
          vblank = vblank && new_vblank_irq;
        }
        if (!STAT.if_ && (hblank || vblank || y_compare)) {
          HOOK(trigger_stat_from_write_cccii, y_compare ? 'Y' : '.',
               vblank ? 'V' : '.', hblank ? 'H' : '.', PPU.ly,
               TICKS + CPU_TICK);
          INTR.new_if |= IF_STAT;
          INTR.if_ |= IF_STAT;
          STAT.if_ = TRUE;
        }
      }
      STAT.y_compare.irq = UNPACK(value, STAT_YCOMPARE_INTR);
      STAT.mode2.irq = UNPACK(value, STAT_MODE2_INTR);
      STAT.vblank.irq = new_vblank_irq;
      STAT.hblank.irq = new_hblank_irq;
      calculate_next_ppu_intr(e);
      break;
    }
    case IO_SCY_ADDR:
      ppu_mode3_synchronize(e);
      PPU.scy = value;
      break;
    case IO_SCX_ADDR:
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      PPU.scx = value;
      break;
    case IO_LY_ADDR:
      break;
    case IO_LYC_ADDR:
      ppu_synchronize(e);
      PPU.lyc = value;
      if (LCDC.display) {
        check_ly_eq_lyc(e, TRUE);
        check_stat(e);
      }
      calculate_next_ppu_intr(e);
      break;
    case IO_DMA_ADDR:
      /* DMA can be restarted. */
      dma_synchronize(e);
      DMA.sync_ticks = TICKS;
      DMA.tick_count = 0;
      DMA.state = (DMA.state != DMA_INACTIVE ? DMA.state : DMA_TRIGGERED);
      DMA.source = value << 8;
      break;
    case IO_BGP_ADDR:
    case IO_OBP0_ADDR:
    case IO_OBP1_ADDR: {
      PaletteType type = addr - IO_BGP_ADDR;
      Palette* pal = &PPU.pal[type];
      ppu_mode3_synchronize(e);
      pal->color[3] = UNPACK(value, PALETTE_COLOR3);
      pal->color[2] = UNPACK(value, PALETTE_COLOR2);
      pal->color[1] = UNPACK(value, PALETTE_COLOR1);
      pal->color[0] = UNPACK(value, PALETTE_COLOR0);
      update_bw_palette_rgba(e, type);
      break;
    }
    case IO_WY_ADDR:
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      PPU.wy = value;
      break;
    case IO_WX_ADDR:
      ppu_mode3_synchronize(e);
      PPU.wx = value;
      break;
    case IO_KEY1_ADDR:
      if (IS_CGB) {
        CPU_SPEED.switching = UNPACK(value, KEY1_PREPARE_SPEED_SWITCH);
      }
      break;
    case IO_VBK_ADDR:
      if (IS_CGB) {
        VRAM.bank = UNPACK(value, VBK_VRAM_BANK);
        VRAM.offset = VRAM.bank << 13;
      }
      break;
    case IO_HDMA1_ADDR:
      if (IS_CGB) {
        HDMA.source = (HDMA.source & 0x00ff) | (value << 8);
      }
      break;
    case IO_HDMA2_ADDR:
      if (IS_CGB) {
        HDMA.source = (HDMA.source & 0xff00) | (value & 0xf0);
      }
      break;
    case IO_HDMA3_ADDR:
      if (IS_CGB) {
        HDMA.dest = (HDMA.dest & 0x00ff) | (value << 8);
      }
      break;
    case IO_HDMA4_ADDR:
      if (IS_CGB) {
        HDMA.dest = (HDMA.dest & 0xff00) | (value & 0xf0);
      }
      break;
    case IO_HDMA5_ADDR:
      if (IS_CGB) {
        HdmaTransferMode new_mode = UNPACK(value, HDMA5_TRANSFER_MODE);
        u8 new_blocks = UNPACK(value, HDMA5_BLOCKS);
        if (HDMA.mode == HDMA_TRANSFER_MODE_HDMA &&
            (HDMA.blocks & 0x80) == 0) { /* HDMA Active */
          if (new_mode == HDMA_TRANSFER_MODE_GDMA) {
            /* Stop HDMA copy. */
            HDMA.blocks |= 0x80 | new_blocks;
          } else {
            HDMA.blocks = new_blocks;
            HDMA.mode = new_mode;
          }
        } else {
          HDMA.mode = new_mode;
          HDMA.blocks = new_blocks;
        }
        if (HDMA.mode == HDMA_TRANSFER_MODE_GDMA) {
          HDMA.state = DMA_ACTIVE;
        }
      }
      break;
    case IO_RP_ADDR:
      if (IS_CGB) {
        INFRARED.write = UNPACK(value, RP_WRITE_DATA);
        INFRARED.enabled = UNPACK(value, RP_DATA_READ_ENABLE);
      }
      break;
    case IO_BCPS_ADDR:
    case IO_OCPS_ADDR:
      if (IS_CGB) {
        ppu_mode3_synchronize(e);
        ColorPalettes* cp = addr == IO_BCPS_ADDR ? &PPU.bgcp : &PPU.obcp;
        cp->index = UNPACK(value, XCPS_INDEX);
        cp->auto_increment = UNPACK(value, XCPS_AUTO_INCREMENT);
      }
      break;
    case IO_BCPD_ADDR:
    case IO_OCPD_ADDR:
      if (IS_CGB) {
        ppu_mode3_synchronize(e);
        ColorPalettes* cp = addr == IO_BCPD_ADDR ? &PPU.bgcp : &PPU.obcp;
        cp->data[cp->index] = value;
        u8 palette_index = (cp->index >> 3) & 7;
        u8 color_index = (cp->index >> 1) & 3;
        u16 color16 = (cp->data[cp->index | 1] << 8) | cp->data[cp->index & ~1];
        RGBA color = unpack_cgb_color(e, color16);
        cp->palettes[palette_index].color[color_index] = color;
        if (cp->auto_increment) {
          cp->index = (cp->index + 1) & 0x3f;
        }
      }
      break;
    case IO_SVBK_ADDR:
      if (IS_CGB) {
        WRAM.bank = UNPACK(value, SVBK_WRAM_BANK);
        WRAM.offset = WRAM.bank == 0 ? 0x1000 : (WRAM.bank << 12);
      }
      break;
    case IO_IE_ADDR:
      INTR.ie = value;
      break;
    default:
      HOOK(write_io_ignored_as, addr, get_io_reg_string(addr), value);
      break;
  }
}